

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int secp256k1_clz64_var(uint64_t x)

{
  long lVar1;
  int ret;
  uint64_t x_local;
  
  if (x == 0) {
    x_local._4_4_ = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (x != 0) {
      for (; x >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    x_local._4_4_ = (uint)lVar1 ^ 0x3f;
  }
  return x_local._4_4_;
}

Assistant:

SECP256K1_INLINE static int secp256k1_clz64_var(uint64_t x) {
    int ret;
    if (!x) {
        return 64;
    }
# if defined(HAVE_BUILTIN_CLZLL)
    ret = __builtin_clzll(x);
# else
    /*FIXME: debruijn fallback. */
    for (ret = 0; ((x & (1ULL << 63)) == 0); x <<= 1, ret++);
# endif
    return ret;
}